

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void initOptions(void)

{
  char **ppcVar1;
  int *piVar2;
  
  ppcVar1 = (char **)malloc(0x30);
  booleanOptionTags = ppcVar1;
  piVar2 = (int *)malloc(0x18);
  *ppcVar1 = "sat";
  ppcVar1[1] = "unsat";
  ppcVar1[2] = "reorder";
  ppcVar1[3] = "help";
  ppcVar1[5] = "h";
  ppcVar1[4] = "min-variables";
  booleanOptions = piVar2;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 1;
  piVar2[3] = 0;
  piVar2[5] = 0;
  piVar2[4] = 0;
  ppcVar1 = (char **)malloc(0x10);
  intOptionTags = ppcVar1;
  intOptions = (int *)malloc(8);
  *intOptions = 0;
  intOptions[1] = 1;
  *ppcVar1 = "n";
  ppcVar1[1] = "s";
  ppcVar1 = (char **)malloc(8);
  stringOptionTags = ppcVar1;
  stringOptions = (char **)malloc(8);
  *stringOptions = (char *)0x0;
  *ppcVar1 = "m";
  return;
}

Assistant:

void initOptions()
{
    booleanOptionTags = (char **) malloc (MAX_BOOLEAN_OPTIONS*sizeof (char *));
    booleanOptions = (int *) malloc (MAX_BOOLEAN_OPTIONS*sizeof(int));

    booleanOptionTags[SAT] = "sat";
    booleanOptions[SAT] = 0;
    booleanOptionTags[UNSAT] = "unsat";
    booleanOptions[UNSAT] = 0;
    booleanOptionTags[REORDER] = "reorder";
    booleanOptions[REORDER] = 1;
    booleanOptionTags[HELP] = "help";
    booleanOptions[HELP] = 0;
    booleanOptionTags[HELP_SHORT] = "h";
    booleanOptions[HELP_SHORT] = 0;
    booleanOptionTags[MIN_VARIABLES] = "min-variables";
    booleanOptions[MIN_VARIABLES] = 0;

    intOptionTags = (char **) malloc (MAX_INT_OPTIONS*sizeof (char *));
    intOptions = (int *) malloc (MAX_INT_OPTIONS*sizeof(int));

    intOptionTags[NUM_VARIABLES] = "n";
    intOptions[NUM_VARIABLES] = 0;
    intOptionTags[RANDOM_SEED] = "s";
    intOptions[RANDOM_SEED] = 1;

    stringOptionTags = (char **) malloc (MAX_STRING_OPTIONS*sizeof (char *));
    stringOptions = (char **) malloc (MAX_STRING_OPTIONS*sizeof(char *));

    stringOptionTags[MODEL] = "m";
    stringOptions[MODEL] = NULL;

}